

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::(anonymous_namespace)::ToJsonName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view input)

{
  bool bVar1;
  const_iterator pvVar2;
  char character;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  undefined1 auStack_20 [7];
  bool capitalize_next;
  string_view input_local;
  string *result;
  
  input_local._M_len = input._M_len;
  bVar1 = false;
  _auStack_20 = this;
  input_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  for (; __end2 != pvVar2; __end2 = __end2 + 1) {
    if (*__end2 == '_') {
      bVar1 = true;
    }
    else if (bVar1) {
      absl::lts_20240722::ascii_toupper(*__end2);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      bVar1 = false;
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToJsonName(const absl::string_view input) {
  bool capitalize_next = false;
  std::string result;
  result.reserve(input.size());

  for (char character : input) {
    if (character == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(absl::ascii_toupper(character));
      capitalize_next = false;
    } else {
      result.push_back(character);
    }
  }

  return result;
}